

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglconvenience.cpp
# Opt level: O0

bool q_hasEglExtension(EGLDisplay display,char *extensionName)

{
  bool bVar1;
  char *pcVar2;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QList<QByteArray> extensions;
  char **in_stack_ffffffffffffff98;
  QListSpecialMethodsBase<QByteArray> *this;
  QListSpecialMethodsBase<QByteArray> local_40 [24];
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaa;
  uStack_24 = 0xaaaaaaaa;
  uStack_20 = 0xaaaaaaaa;
  uStack_1c = 0xaaaaaaaa;
  pcVar2 = (char *)eglQueryString(in_RDI,0x3055);
  this = local_40;
  QByteArray::QByteArray((QByteArray *)this,pcVar2,-1);
  QByteArray::split((char)&local_28);
  QByteArray::~QByteArray((QByteArray *)0x953f26);
  bVar1 = QListSpecialMethodsBase<QByteArray>::contains<char_const*>(this,in_stack_ffffffffffffff98)
  ;
  QList<QByteArray>::~QList((QList<QByteArray> *)0x953f43);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool q_hasEglExtension(EGLDisplay display, const char* extensionName)
{
    QList<QByteArray> extensions =
        QByteArray(reinterpret_cast<const char *>
            (eglQueryString(display, EGL_EXTENSIONS))).split(' ');
    return extensions.contains(extensionName);
}